

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

TestCaseGroup * __thiscall deqp::gls::fboc::details::Context::createRenderableTests(Context *this)

{
  char *name;
  char *description;
  TestNode *this_00;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar1;
  TestNode *node_01;
  TestNode *node_02;
  _Base_ptr p_Var2;
  AttPoint *pAVar3;
  _Self __tmp;
  _Self __tmp_1;
  RenderableParams params;
  Formats texFmts;
  Formats rboFmts;
  
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,this->m_testCtx,"renderable",
             "Tests for support of renderable image formats");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,this->m_testCtx,"renderbuffer","Tests for renderbuffer formats");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,this->m_testCtx,"texture","Tests for texture formats");
  FboUtil::FormatDB::getFormats(&rboFmts,&this->m_allFormats,ANY_FORMAT);
  FboUtil::FormatDB::getFormats(&texFmts,&this->m_allFormats,ANY_FORMAT);
  pAVar3 = createRenderableTests::attPoints;
  while( true ) {
    if (pAVar3 == (AttPoint *)&TestBase::vtable) break;
    pTVar1 = (TestNode *)operator_new(0x70);
    name = pAVar3->name;
    description = pAVar3->desc;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,this->m_testCtx,name,description);
    node_01 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node_01,this->m_testCtx,name,description);
    for (p_Var2 = rboFmts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &rboFmts._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      params.attPoint = pAVar3->attPoint;
      params.bufType = 0x8d41;
      params.format.format = p_Var2[1]._M_color;
      params.format.unsizedType = *(GLenum *)&p_Var2[1].field_0x4;
      node_02 = (TestNode *)operator_new(0x88);
      RenderableTest::RenderableTest((RenderableTest *)node_02,this,&params);
      tcu::TestNode::addChild(pTVar1,node_02);
    }
    tcu::TestNode::addChild(node,pTVar1);
    for (p_Var2 = texFmts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &texFmts._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      params.attPoint = pAVar3->attPoint;
      params.bufType = 0x1702;
      params.format.format = p_Var2[1]._M_color;
      params.format.unsizedType = *(GLenum *)&p_Var2[1].field_0x4;
      pTVar1 = (TestNode *)operator_new(0x88);
      RenderableTest::RenderableTest((RenderableTest *)pTVar1,this,&params);
      tcu::TestNode::addChild(node_01,pTVar1);
    }
    tcu::TestNode::addChild(node_00,node_01);
    pAVar3 = pAVar3 + 1;
  }
  tcu::TestNode::addChild(this_00,node);
  tcu::TestNode::addChild(this_00,node_00);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&texFmts._M_t);
  std::
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~_Rb_tree(&rboFmts._M_t);
  return (TestCaseGroup *)this_00;
}

Assistant:

TestCaseGroup* Context::createRenderableTests (void)
{
	TestCaseGroup* const renderableTests = new TestCaseGroup(
		m_testCtx, "renderable", "Tests for support of renderable image formats");

	TestCaseGroup* const rbRenderableTests = new TestCaseGroup(
		m_testCtx, "renderbuffer", "Tests for renderbuffer formats");

	TestCaseGroup* const texRenderableTests = new TestCaseGroup(
		m_testCtx, "texture", "Tests for texture formats");

	static const struct AttPoint {
		GLenum			attPoint;
		const char*		name;
		const char*		desc;
	} attPoints[] =
	{
		{ GL_COLOR_ATTACHMENT0,		"color0",	"Tests for color attachments"	},
		{ GL_STENCIL_ATTACHMENT,	"stencil",	"Tests for stencil attachments" },
		{ GL_DEPTH_ATTACHMENT,		"depth",	"Tests for depth attachments"	},
	};

	// At each attachment point, iterate through all the possible formats to
	// detect both false positives and false negatives.
	const Formats rboFmts = m_allFormats.getFormats(ANY_FORMAT);
	const Formats texFmts = m_allFormats.getFormats(ANY_FORMAT);

	for (const AttPoint* it = DE_ARRAY_BEGIN(attPoints); it != DE_ARRAY_END(attPoints); it++)
	{
		TestCaseGroup* const rbAttTests = new TestCaseGroup(m_testCtx, it->name, it->desc);
		TestCaseGroup* const texAttTests = new TestCaseGroup(m_testCtx, it->name, it->desc);

		for (Formats::const_iterator it2 = rboFmts.begin(); it2 != rboFmts.end(); it2++)
		{
			const RenderableParams params = { it->attPoint, GL_RENDERBUFFER, *it2 };
			rbAttTests->addChild(new RenderableTest(*this, params));
		}
		rbRenderableTests->addChild(rbAttTests);

		for (Formats::const_iterator it2 = texFmts.begin(); it2 != texFmts.end(); it2++)
		{
			const RenderableParams params = { it->attPoint, GL_TEXTURE, *it2 };
			texAttTests->addChild(new RenderableTest(*this, params));
		}
		texRenderableTests->addChild(texAttTests);
	}
	renderableTests->addChild(rbRenderableTests);
	renderableTests->addChild(texRenderableTests);

	return renderableTests;
}